

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::CellConfigRuleSyntax::setChild
          (CellConfigRuleSyntax *this,size_t index,TokenOrSyntax child)

{
  long in_RSI;
  
  (*(code *)(&DAT_0046fad0 + *(int *)(&DAT_0046fad0 + in_RSI * 4)))();
  return;
}

Assistant:

void CellConfigRuleSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: cell = child.token(); return;
        case 1: name = child.node() ? &child.node()->as<ConfigCellIdentifierSyntax>() : nullptr; return;
        case 2: ruleClause = child.node() ? &child.node()->as<ConfigRuleClauseSyntax>() : nullptr; return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}